

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::ReadSiCurrentLoopParams(AmpIO *this,uint index,SiCurrentLoopParams *params)

{
  BasePort *pBVar1;
  BasePort *pBVar2;
  uint uVar3;
  uint32_t read_data;
  uint32_t local_2c;
  
  pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
  if (pBVar1 != (BasePort *)0x0) {
    local_2c = 0;
    uVar3 = index * 0x10 + 0x10;
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,(ulong)(uVar3 | 0x9001),
               &local_2c);
    params->kp = local_2c;
    pBVar2 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar2->_vptr_BasePort[0x23])
              (pBVar2,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,(ulong)(uVar3 | 0x9002),
               &local_2c);
    params->ki = local_2c;
    pBVar2 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar2->_vptr_BasePort[0x23])
              (pBVar2,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,(ulong)(uVar3 | 0x9005),
               &local_2c);
    params->kd = local_2c;
    pBVar2 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar2->_vptr_BasePort[0x23])
              (pBVar2,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,(ulong)(uVar3 | 0x9006),
               &local_2c);
    params->ff_resistive = local_2c;
    pBVar2 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar2->_vptr_BasePort[0x23])
              (pBVar2,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,(ulong)(uVar3 | 0x9003),
               &local_2c);
    params->iTermLimit = (uint16_t)local_2c;
    pBVar2 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar2->_vptr_BasePort[0x23])
              (pBVar2,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,(ulong)(uVar3 | 0x9004),
               &local_2c);
    params->dutyCycleLimit = (uint16_t)local_2c;
  }
  return pBVar1 != (BasePort *)0x0;
}

Assistant:

bool AmpIO::ReadSiCurrentLoopParams(unsigned int index, SiCurrentLoopParams& params) const
{
    if (!port) return false;
    uint32_t read_data = 0;
    port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_CURRENT_KP, read_data);
    params.kp = read_data;
    port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_CURRENT_KI, read_data);
    params.ki = read_data;
    port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_CURRENT_KD, read_data);
    params.kd = read_data;
    port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_CURRENT_FF_RESISTIVE, read_data);
    params.ff_resistive = read_data;
    port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_CURRENT_I_TERM_LIMIT, read_data);
    params.iTermLimit = read_data;
    port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_DUTY_CYCLE_LIMIT, read_data);
    params.dutyCycleLimit = read_data;
    return true;
}